

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string dot_extension;
  FilePath *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  string *this_00;
  string *str;
  string local_90 [55];
  string local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  
  str = &local_59;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_59.field_0x1,".",(allocator *)str);
  std::operator+(&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_59.field_0x1,local_18);
  std::__cxx11::string::~string((string *)&local_59.field_0x1);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = String::EndsWithCaseInsensitive(str,in_RSI);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_90,(ulong)in_RSI);
    FilePath((FilePath *)this_00,in_RDI);
    std::__cxx11::string::~string(local_90);
  }
  else {
    FilePath((FilePath *)CONCAT17(bVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return (FilePath *)this_00;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}